

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_pmeth.c
# Opt level: O0

int pkey_ec_kdf_derive(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long *in_RDX;
  size_t *in_RSI;
  uchar *in_RDI;
  int rv;
  size_t ktmplen;
  uchar *ktmp;
  EC_PKEY_CTX *dctx;
  size_t in_stack_00000138;
  uchar *in_stack_00000140;
  size_t in_stack_00000148;
  uchar *in_stack_00000150;
  size_t in_stack_00000158;
  uchar *in_stack_00000160;
  EVP_MD *in_stack_00000170;
  OSSL_LIB_CTX *in_stack_00000178;
  char *in_stack_00000180;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  int local_38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar1 = *(long *)(in_RDI + 0x98);
  iVar4 = 0;
  if (*(char *)(lVar1 + 0x19) == '\x01') {
    iVar4 = pkey_ec_derive((EVP_PKEY_CTX *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI);
  }
  else if (in_RSI == (size_t *)0x0) {
    *in_RDX = *(long *)(lVar1 + 0x38);
    iVar4 = 1;
  }
  else if (*in_RDX == *(long *)(lVar1 + 0x38)) {
    iVar2 = pkey_ec_derive((EVP_PKEY_CTX *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI);
    if (iVar2 == 0) {
      iVar4 = 0;
    }
    else {
      pvVar3 = CRYPTO_malloc(local_38,"crypto/ec/ec_pmeth.c",0xe8);
      if (pvVar3 == (void *)0x0) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                      (int)(in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0);
        ERR_set_error(0x10,0xc0100,(char *)0x0);
        iVar4 = 0;
      }
      else {
        iVar2 = pkey_ec_derive((EVP_PKEY_CTX *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               in_RSI);
        if (iVar2 != 0) {
          line = (int)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
          in_stack_ffffffffffffffb0 = *(char **)(in_RDI + 8);
          in_stack_ffffffffffffffb8 = *(size_t *)(in_RDI + 0x10);
          iVar2 = ossl_ecdh_kdf_X9_63(in_stack_00000160,in_stack_00000158,in_stack_00000150,
                                      in_stack_00000148,in_stack_00000140,in_stack_00000138,
                                      in_stack_00000170,in_stack_00000178,in_stack_00000180);
          if (iVar2 != 0) {
            iVar4 = 1;
          }
        }
        CRYPTO_clear_free((void *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,line);
      }
    }
  }
  else {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int pkey_ec_kdf_derive(EVP_PKEY_CTX *ctx,
                              unsigned char *key, size_t *keylen)
{
    EC_PKEY_CTX *dctx = ctx->data;
    unsigned char *ktmp = NULL;
    size_t ktmplen;
    int rv = 0;
    if (dctx->kdf_type == EVP_PKEY_ECDH_KDF_NONE)
        return pkey_ec_derive(ctx, key, keylen);
    if (!key) {
        *keylen = dctx->kdf_outlen;
        return 1;
    }
    if (*keylen != dctx->kdf_outlen)
        return 0;
    if (!pkey_ec_derive(ctx, NULL, &ktmplen))
        return 0;
    if ((ktmp = OPENSSL_malloc(ktmplen)) == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    if (!pkey_ec_derive(ctx, ktmp, &ktmplen))
        goto err;
    /* Do KDF stuff */
    if (!ossl_ecdh_kdf_X9_63(key, *keylen, ktmp, ktmplen,
                             dctx->kdf_ukm, dctx->kdf_ukmlen, dctx->kdf_md,
                             ctx->libctx, ctx->propquery))
        goto err;
    rv = 1;

 err:
    OPENSSL_clear_free(ktmp, ktmplen);
    return rv;
}